

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageSizeBase::CheckProgram(ShaderImageSizeBase *this,GLuint program)

{
  GLuint GVar1;
  undefined4 uVar2;
  GLsizei maxCount;
  GLint GVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  allocator_type local_b9;
  undefined1 local_b8 [8];
  vector<char,_std::allocator<char>_> log_1;
  GLint length;
  vector<char,_std::allocator<char>_> log;
  undefined1 local_78 [8];
  vector<char,_std::allocator<char>_> source;
  GLint length_1;
  GLenum type;
  GLint i;
  allocator<unsigned_int> local_41;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  int local_20;
  GLint attached_shaders;
  GLint status;
  GLuint program_local;
  ShaderImageSizeBase *this_local;
  
  if (program == 0) {
    this_local._7_1_ = true;
  }
  else {
    attached_shaders = program;
    _status = this;
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,0x8b82,
               &local_20);
    if (local_20 == 0) {
      glu::CallLogWrapper::glGetProgramiv
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,attached_shaders,
                 0x8b85,(GLint *)((long)&shaders.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (0 < shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_) {
        sVar4 = (size_type)
                shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
        std::allocator<unsigned_int>::allocator(&local_41);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,sVar4,&local_41);
        std::allocator<unsigned_int>::~allocator(&local_41);
        GVar3 = attached_shaders;
        maxCount = shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
        glu::CallLogWrapper::glGetAttachedShaders
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar3,maxCount,
                   (GLsizei *)0x0,pvVar5);
        for (length_1 = 0;
            length_1 <
            shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_; length_1 = length_1 + 1) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                              (long)length_1);
          glu::CallLogWrapper::glGetShaderiv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b4f,
                     (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x14);
          if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8b30) {
            anon_unknown_0::Output("*** Fragment Shader ***\n");
          }
          else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8b31)
          {
            anon_unknown_0::Output("*** Vertex Shader ***\n");
          }
          else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8dd9)
          {
            anon_unknown_0::Output("*** Geometry Shader ***\n");
          }
          else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8e87)
          {
            anon_unknown_0::Output("*** Tessellation Evaluation Shader ***\n");
          }
          else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x8e88)
          {
            anon_unknown_0::Output("*** Tessellation Control Shader ***\n");
          }
          else if (source.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == 0x91b9)
          {
            anon_unknown_0::Output("*** Compute Shader ***\n");
          }
          else {
            anon_unknown_0::Output("*** Unknown Shader ***\n");
          }
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                              (long)length_1);
          glu::CallLogWrapper::glGetShaderiv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b88,
                     (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10);
          if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
            sVar4 = (size_type)
                    (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
            std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)local_78,sVar4,
                       (allocator_type *)
                       &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &log.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                                (long)length_1);
            uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
            GVar1 = *pvVar5;
            pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_78,0);
            glu::CallLogWrapper::glGetShaderSource
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                       (GLsizei *)0x0,pvVar6);
            pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_78,0);
            anon_unknown_0::Output("%s\n",pvVar6);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)local_78);
          }
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                              (long)length_1);
          glu::CallLogWrapper::glGetShaderiv
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,*pvVar5,0x8b84,
                     (GLint *)&source.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10);
          if (0 < (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
            sVar4 = (size_type)
                    (int)source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
            std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&length,sVar4,
                       (allocator_type *)
                       &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       &log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
            pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                                (long)length_1);
            uVar2 = source.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
            GVar1 = *pvVar5;
            pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)&length,0);
            glu::CallLogWrapper::glGetShaderInfoLog
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,uVar2,
                       (GLsizei *)0x0,pvVar6);
            pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)&length,0);
            anon_unknown_0::Output("%s\n",pvVar6);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)&length);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      }
      glu::CallLogWrapper::glGetProgramiv
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,attached_shaders,
                 0x8b84,(GLint *)&log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  field_0x10);
      if (0 < (int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_) {
        sVar4 = (size_type)(int)log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_
        ;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_b8,sVar4,&local_b9);
        std::allocator<char>::~allocator(&local_b9);
        GVar3 = attached_shaders;
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_b8,0);
        glu::CallLogWrapper::glGetProgramInfoLog
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar3,
                   log_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_,
                   (GLsizei *)0x0,pvVar6);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_b8,0);
        anon_unknown_0::Output("%s\n",pvVar6);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_b8);
      }
    }
    this_local._7_1_ = local_20 == 1;
  }
  return this_local._7_1_;
}

Assistant:

bool CheckProgram(GLuint program)
	{
		if (program == 0)
			return true;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}
		return status == GL_TRUE ? true : false;
	}